

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeR.cpp
# Opt level: O2

void __thiscall OpenMD::ChargeR::process(ChargeR *this)

{
  pointer pvVar1;
  long lVar2;
  pointer pdVar3;
  AtomType *pAVar4;
  SelectionManager *this_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint i;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  RealType RVar13;
  double dVar14;
  int ii;
  Vector3d pos;
  FluctuatingChargeAdapter fqa;
  StuntDouble *sd;
  DumpReader reader;
  int local_12dc;
  double local_12d8;
  double local_12d0;
  SelectionSet local_12c8;
  SelectionEvaluator *local_12b0;
  SelectionManager *local_12a8;
  ulong local_12a0;
  FluctuatingChargeAdapter local_1298;
  StuntDouble *local_1290;
  DumpReader local_1288;
  
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar6 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar6 / (this->super_StaticAnalyser).step_;
  local_12b0 = &this->evaluator_;
  local_12a8 = &this->seleMan_;
  uVar9 = 0;
  while( true ) {
    this_00 = local_12a8;
    if (iVar6 <= (int)uVar9) break;
    DumpReader::readFrame(&local_1288,(int)uVar9);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    uVar11 = (this->super_StaticAnalyser).nBins_;
    pvVar1 = (this->sliceSDLists_).
             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 0; (ulong)uVar11 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
      lVar2 = *(long *)((long)&(pvVar1->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar8);
      if (*(long *)((long)&(pvVar1->
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish + lVar8) != lVar2) {
        *(long *)((long)&(pvVar1->
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish + lVar8) = lVar2;
      }
    }
    if ((this->evaluator_).isDynamic_ != false) {
      SelectionEvaluator::evaluate(&local_12c8,local_12b0);
      SelectionManager::setSelectionSet(this_00,&local_12c8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12c8.bitsets_);
    }
    local_1290 = SelectionManager::beginSelected(this_00,&local_12dc);
    while (local_1290 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12c8,local_1290);
      dVar12 = Vector<double,_3U>::length((Vector<double,_3U> *)&local_12c8);
      if (dVar12 < this->len_) {
        iVar7 = (int)(dVar12 / this->deltaR_);
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                  ((this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar7,&local_1290);
        pdVar3 = (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[iVar7] = pdVar3[iVar7] + 1.0;
      }
      local_1290 = SelectionManager::nextSelected(this_00,&local_12dc);
    }
    local_1290 = (value_type)0x0;
    local_12a0 = uVar9;
    for (uVar10 = 0; uVar10 < (this->super_StaticAnalyser).nBins_; uVar10 = uVar10 + 1) {
      uVar11 = 0;
      dVar12 = 0.0;
      while( true ) {
        pvVar1 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = *(long *)&pvVar1[uVar10].
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)pvVar1[uVar10].
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lVar8 >> 3) <= (ulong)uVar11)
        break;
        lVar8 = *(long *)(lVar8 + (ulong)uVar11 * 8);
        dVar14 = 0.0;
        if (*(uint *)(lVar8 + 8) < 2) {
          pAVar4 = *(AtomType **)(lVar8 + 0x78);
          local_12d0 = dVar12;
          local_12c8.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pAVar4;
          bVar5 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&local_12c8);
          dVar12 = 0.0;
          if (bVar5) {
            RVar13 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&local_12c8);
            dVar12 = RVar13 + 0.0;
          }
          local_12d8 = dVar12;
          local_1298.at_ = pAVar4;
          bVar5 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_1298);
          dVar12 = local_12d0;
          dVar14 = local_12d8;
          if (bVar5) {
            dVar14 = local_12d8 +
                     *(double *)
                      (*(long *)(*(long *)(*(long *)(lVar8 + 0x18) + 0x18) + 0x150 +
                                *(long *)(lVar8 + 0x10)) + (long)*(int *)(lVar8 + 0x30) * 8);
          }
        }
        dVar12 = dVar12 + dVar14;
        uVar11 = uVar11 + 1;
      }
      pdVar3 = (this->chargeR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[uVar10] = dVar12 + pdVar3[uVar10];
    }
    uVar9 = (ulong)(uint)((int)local_12a0 + (this->super_StaticAnalyser).step_);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeR::process() {
    StuntDouble* sd;
    int ii;

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos      = sd->getPos();
        RealType distance = pos.length();

        if (distance < len_) {
          int binNo = int(distance / deltaR_);
          sliceSDLists_[binNo].push_back(sd);
          sliceSDCount_[binNo]++;
        }
      }

      // loop over the slices to calculate the charge
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binC = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][k]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][k]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) { q += fca.getCharge(); }

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
          }

          binC += q;
        }
        chargeR_[i] += binC;
        // Units of (e / Ang^2 / fs)
      }
    }

    writeChargeR();
  }